

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O0

void DivVerifyUint64Int16_2(void)

{
  bool bVar1;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si2;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  TestCase<short,_unsigned_long,_2> test;
  TestVector<short,_unsigned_long,_2> tests;
  short *in_stack_ffffffffffffff58;
  allocator *in_stack_ffffffffffffff60;
  TestVector<short,_unsigned_long,_2> *in_stack_ffffffffffffff70;
  unsigned_long in_stack_ffffffffffffff78;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [32];
  undefined4 local_50;
  int local_4c;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_48 [4];
  undefined4 local_38;
  byte local_31;
  unsigned_long in_stack_ffffffffffffffd8;
  undefined1 expected;
  byte in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  short in_stack_ffffffffffffffee;
  string *in_stack_fffffffffffffff0;
  
  TestVector<short,_unsigned_long,_2>::TestVector
            ((TestVector<short,_unsigned_long,_2> *)&stack0xffffffffffffffe8);
  TestVector<short,_unsigned_long,_2>::GetNext(in_stack_ffffffffffffff70);
  while( true ) {
    expected = (undefined1)(in_stack_ffffffffffffffd8 >> 0x38);
    bVar1 = TestVector<short,_unsigned_long,_2>::Done
                      ((TestVector<short,_unsigned_long,_2> *)&stack0xffffffffffffffe8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_31 = 1;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<short>((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (local_48);
    local_50 = local_38;
    local_4c = (int)operator/(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    local_48[0] = (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   )local_4c;
    if ((local_31 & 1) != (in_stack_ffffffffffffffe0 & 1)) {
      in_stack_ffffffffffffff60 = &local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,"Error in case int16_uint64_2 throw: ",in_stack_ffffffffffffff60);
      err_msg<short,unsigned_long>
                (in_stack_fffffffffffffff0,in_stack_ffffffffffffffee,
                 CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),(bool)expected);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    TestVector<short,_unsigned_long,_2>::GetNext(in_stack_ffffffffffffff70);
    in_stack_ffffffffffffffe0 = (byte)in_stack_ffffffffffffff80.m_int;
    in_stack_ffffffffffffffd8 = in_stack_ffffffffffffff78;
  }
  return;
}

Assistant:

void DivVerifyUint64Int16_2()
{
    TestVector< std::int16_t, std::uint64_t, OpType::Div2 > tests;
    TestCase< std::int16_t, std::uint64_t, OpType::Div2 > test = tests.GetNext();

    while (!tests.Done())
    {
      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::int32_t> si(test.x);
         SafeInt<std::int32_t> si2;

         si2 = test.y / si;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case int16_uint64_2 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}